

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O1

void uv__fs_work(uv__work *w)

{
  uv_loop_s **buf;
  int iVar1;
  uv__work *ptr;
  iovec *__iovec;
  _func_void_uv__work_ptr_int *p_Var2;
  bool bVar3;
  __mode_t __mode;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uv_dirent_type_t uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint *puVar12;
  size_t sVar13;
  _func_void_uv__work_ptr *p_Var14;
  ssize_t sVar15;
  size_t sVar16;
  _func_void_uv__work_ptr *p_Var17;
  dirent64 *dent;
  char *pcVar18;
  ulong uVar19;
  DIR *pDVar20;
  size_t sVar21;
  void *__buf;
  code *pcVar22;
  _func_void_uv__work_ptr_int *p_Var23;
  _func_void_uv__work_ptr_int *p_Var24;
  long lVar25;
  _func_void_uv__work_ptr_int *p_Var26;
  size_t sVar27;
  double dVar28;
  pollfd pfd;
  stat dst_statsbuf;
  stat pbuf;
  stat64 local_21d0;
  stat64 local_2140;
  statfs64 local_20b0;
  undefined1 local_2038 [16];
  void *local_2028;
  void *local_2020;
  uint local_2018;
  int iStack_2014;
  uv_loop_s *local_2010;
  void *local_2008;
  __fsid_t local_2000;
  uv_fs_type local_1ff8;
  undefined4 uStack_1ff4;
  uv_loop_t *local_1ff0;
  uv_fs_cb p_Stack_1fe8;
  _func_void_uv__work_ptr_int *local_1fe0;
  uv_loop_s *puStack_1fd8;
  _func_void_uv__work_ptr *local_1fd0;
  _func_void_uv__work_ptr_int *local_1fc8;
  char *local_1f28;
  int local_1f20;
  uint local_1f1c;
  uv_buf_t *local_1f10;
  _func_void_uv__work_ptr_int *local_1f08;
  uv__work local_1ee8;
  size_t local_1eb8;
  
  iVar1 = *(int *)&w[-7].done;
  puVar12 = (uint *)__errno_location();
  buf = &w[-6].loop;
  do {
    *puVar12 = 0;
    switch(*(undefined4 *)&w[-7].done) {
    case 1:
      iVar4 = open64((char *)w[-6].done,*(uint *)((long)w[-2].wq + 4) | 0x80000,
                     (ulong)*(uint *)(w[-2].wq + 1));
      break;
    case 2:
      iVar4 = uv__close_nocancel(*(int *)w[-2].wq);
      if (iVar4 == -1) {
        iVar4 = -(uint)(*puVar12 != 0x73 && *puVar12 != 4);
      }
      break;
    case 3:
      uVar8 = uv__getiovmax();
      if (uVar8 < *(uint *)((long)w[-2].wq + 0xc)) {
        *(uint *)((long)w[-2].wq + 0xc) = uVar8;
      }
      p_Var24 = w[-1].done;
      iVar4 = *(int *)((long)w[-2].wq + 0xc);
      if ((long)p_Var24 < 0) {
        if (iVar4 == 1) {
          p_Var24 = (_func_void_uv__work_ptr_int *)
                    read(*(int *)w[-2].wq,*(void **)w[-1].work,*(size_t *)(w[-1].work + 8));
        }
        else {
          p_Var24 = (_func_void_uv__work_ptr_int *)readv(*(int *)w[-2].wq,(iovec *)w[-1].work,iVar4)
          ;
        }
      }
      else if (iVar4 == 1) {
        p_Var24 = (_func_void_uv__work_ptr_int *)
                  pread64(*(int *)w[-2].wq,*(void **)w[-1].work,*(size_t *)(w[-1].work + 8),
                          (__off64_t)p_Var24);
      }
      else {
        if (uv__fs_read_no_preadv != '\x01') {
          p_Var24 = (_func_void_uv__work_ptr_int *)
                    uv__preadv(*(int *)w[-2].wq,(iovec *)w[-1].work,iVar4,(int64_t)p_Var24);
          if ((p_Var24 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) ||
             (p_Var24 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff, *puVar12 != 0x26))
          goto LAB_00180fff;
          uv__fs_read_no_preadv = '\x01';
        }
        uVar19 = (ulong)*(uint *)((long)w[-2].wq + 0xc);
        if (uVar19 == 0) {
          __assert_fail("nbufs > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/fs.c"
                        ,0x184,"ssize_t uv__fs_preadv(uv_file, uv_buf_t *, unsigned int, off_t)");
        }
        iVar4 = *(int *)w[-2].wq;
        p_Var26 = w[-1].done;
        p_Var14 = w[-1].work;
        p_Var17 = p_Var14 + uVar19 * 0x10;
        p_Var24 = (_func_void_uv__work_ptr_int *)0x0;
        do {
          uVar19 = 0;
          do {
            do {
              sVar15 = pread64(iVar4,(void *)(*(long *)p_Var14 + uVar19),
                               *(long *)(p_Var14 + 8) - uVar19,(__off64_t)(p_Var26 + (long)p_Var24))
              ;
              if (sVar15 != -1) break;
            } while (*puVar12 == 4);
            if (sVar15 == 0) goto LAB_00180fff;
            if (sVar15 == -1 && p_Var24 == (_func_void_uv__work_ptr_int *)0x0) {
              p_Var24 = (_func_void_uv__work_ptr_int *)-(long)(int)*puVar12;
              goto LAB_00180fff;
            }
            if (sVar15 == -1) goto LAB_00180fff;
            uVar19 = uVar19 + sVar15;
            p_Var24 = p_Var24 + sVar15;
          } while (uVar19 < *(ulong *)(p_Var14 + 8));
          p_Var14 = p_Var14 + 0x10;
        } while (p_Var14 != p_Var17);
      }
LAB_00180fff:
      ptr = (uv__work *)w[-1].work;
      goto joined_r0x00180a98;
    case 4:
      uVar5 = uv__getiovmax();
      uVar8 = *(uint *)((long)w[-2].wq + 0xc);
      ptr = (uv__work *)w[-1].work;
      if (uVar8 == 0) {
        p_Var24 = (_func_void_uv__work_ptr_int *)0x0;
      }
      else {
        p_Var24 = (_func_void_uv__work_ptr_int *)0x0;
        do {
          uVar6 = uVar5;
          if (uVar8 < uVar5) {
            uVar6 = uVar8;
          }
          *(uint *)((long)w[-2].wq + 0xc) = uVar6;
          do {
            p_Var26 = w[-1].done;
            iVar4 = *(int *)((long)w[-2].wq + 0xc);
            if ((long)p_Var26 < 0) {
              __iovec = (iovec *)w[-1].work;
              if (iVar4 == 1) {
                p_Var26 = (_func_void_uv__work_ptr_int *)
                          write(*(int *)w[-2].wq,__iovec->iov_base,__iovec->iov_len);
              }
              else {
                p_Var26 = (_func_void_uv__work_ptr_int *)writev(*(int *)w[-2].wq,__iovec,iVar4);
              }
            }
            else {
              if (iVar4 == 1) {
                iVar4 = *(int *)w[-2].wq;
                __buf = *(void **)w[-1].work;
                sVar13 = *(size_t *)(w[-1].work + 8);
              }
              else {
                if (uv__fs_write_no_pwritev != '\x01') {
                  p_Var26 = (_func_void_uv__work_ptr_int *)
                            uv__pwritev(*(int *)w[-2].wq,(iovec *)w[-1].work,iVar4,(int64_t)p_Var26)
                  ;
                  if ((p_Var26 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) ||
                     (p_Var26 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff, *puVar12 != 0x26)
                     ) goto LAB_00180343;
                  uv__fs_write_no_pwritev = '\x01';
                }
                iVar4 = *(int *)w[-2].wq;
                __buf = *(void **)w[-1].work;
                sVar13 = *(size_t *)(w[-1].work + 8);
                p_Var26 = w[-1].done;
              }
              p_Var26 = (_func_void_uv__work_ptr_int *)
                        pwrite64(iVar4,__buf,sVar13,(__off64_t)p_Var26);
            }
LAB_00180343:
          } while (((long)p_Var26 < 0) && (*puVar12 == 4));
          if ((long)p_Var26 < 1) {
            if (p_Var24 == (_func_void_uv__work_ptr_int *)0x0) {
              p_Var24 = p_Var26;
            }
            break;
          }
          if (-1 < (long)w[-1].done) {
            w[-1].done = w[-1].done + (long)p_Var26;
          }
          p_Var14 = w[-1].work;
          pcVar22 = p_Var14 + 8;
          uVar6 = 0;
          p_Var23 = p_Var26;
          do {
            p_Var2 = *(_func_void_uv__work_ptr_int **)pcVar22;
            if (p_Var23 < p_Var2) {
              *(_func_void_uv__work_ptr_int **)(pcVar22 + -8) = p_Var23 + *(ulong *)(pcVar22 + -8);
              *(ulong *)pcVar22 = *(ulong *)pcVar22 - (long)p_Var23;
              break;
            }
            uVar6 = uVar6 + 1;
            pcVar22 = pcVar22 + 0x10;
            p_Var23 = p_Var23 + -(long)p_Var2;
          } while (p_Var23 != (_func_void_uv__work_ptr_int *)0x0);
          *(uint *)((long)w[-2].wq + 0xc) = uVar6;
          w[-1].work = p_Var14 + (ulong)uVar6 * 0x10;
          p_Var24 = p_Var24 + (long)p_Var26;
          uVar8 = uVar8 - uVar6;
        } while (uVar8 != 0);
      }
joined_r0x00180a98:
      if (ptr != w + 1) {
        uv__free(ptr);
      }
      w[-1].work = (_func_void_uv__work_ptr *)0x0;
      *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
      goto LAB_0018102a;
    case 5:
      local_2140.st_dev = (__dev_t)w[-1].done;
      sVar15 = sendfile64(*(int *)w[-2].wq,*(int *)((long)w[-2].wq + 4),(__off64_t *)&local_2140,
                          (size_t)w[1].done);
      if ((sVar15 == -1) && (p_Var26 = w[-1].done, (long)local_2140.st_dev <= (long)p_Var26)) {
        uVar8 = *puVar12;
        if (((uVar8 < 0x17) && ((0x440020U >> (uVar8 & 0x1f) & 1) != 0)) ||
           (p_Var24 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff, uVar8 == 0x58)) {
          *puVar12 = 0;
          p_Var23 = w[1].done;
          if (p_Var23 == (_func_void_uv__work_ptr_int *)0x0) {
            p_Var24 = (_func_void_uv__work_ptr_int *)0x0;
          }
          else {
            iVar4 = *(int *)w[-2].wq;
            iVar9 = *(int *)((long)w[-2].wq + 4);
            bVar3 = true;
            p_Var2 = (_func_void_uv__work_ptr_int *)0x0;
            do {
              while( true ) {
                p_Var24 = p_Var2;
                sVar13 = (long)p_Var23 - (long)p_Var24;
                if (0x1fff < sVar13) {
                  sVar13 = 0x2000;
                }
                do {
                  if (bVar3) {
                    sVar21 = pread64(iVar9,local_2038,sVar13,(__off64_t)p_Var26);
                  }
                  else {
                    sVar21 = read(iVar9,local_2038,sVar13);
                  }
                } while ((sVar21 == 0xffffffffffffffff) && (*puVar12 == 4));
                if (sVar21 == 0) goto LAB_001811a8;
                if (sVar21 == 0xffffffffffffffff) break;
                if (0 < (long)sVar21) {
                  lVar25 = 0;
                  sVar13 = sVar21;
LAB_00180dee:
LAB_00180e01:
                  do {
                    sVar15 = write(iVar4,local_2038 + lVar25,sVar13);
                    if (sVar15 != -1) goto LAB_00180e76;
                    if (*puVar12 != 4) {
                      if (*puVar12 == 0xb) {
                        local_21d0.st_dev._4_2_ = 4;
                        local_21d0.st_dev._6_2_ = 0;
                        local_21d0.st_dev._0_4_ = iVar4;
                        while (iVar11 = poll((pollfd *)&local_21d0,1,-1), iVar11 == -1) {
                          if (*puVar12 != 4) goto LAB_0018118f;
                        }
                        if ((local_21d0.st_dev._6_2_ & 0xfffb) == 0) goto LAB_00180e01;
LAB_0018118f:
                        *puVar12 = 5;
                      }
                      p_Var24 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
                      goto LAB_001811a8;
                    }
                  } while( true );
                }
LAB_00180e8d:
                p_Var26 = p_Var26 + sVar21;
                p_Var24 = p_Var24 + sVar21;
                p_Var2 = p_Var24;
                if (p_Var23 <= p_Var24) goto LAB_001811a8;
              }
              if ((!bVar3) || (p_Var24 != (_func_void_uv__work_ptr_int *)0x0)) break;
              bVar3 = false;
              p_Var2 = (_func_void_uv__work_ptr_int *)0x0;
            } while ((*puVar12 == 5) ||
                    (p_Var2 = (_func_void_uv__work_ptr_int *)0x0, *puVar12 == 0x1d));
            p_Var24 = (_func_void_uv__work_ptr_int *)
                      ((ulong)p_Var24 | -(ulong)(p_Var24 == (_func_void_uv__work_ptr_int *)0x0));
          }
LAB_001811a8:
          if (p_Var24 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) {
            w[-1].done = p_Var26;
          }
        }
      }
      else {
        p_Var24 = (_func_void_uv__work_ptr_int *)(local_2140.st_dev + -(long)w[-1].done);
        w[-1].done = (_func_void_uv__work_ptr_int *)local_2140.st_dev;
      }
      goto LAB_0018102a;
    case 6:
      p_Var24 = w[-6].done;
      iVar4 = uv__fs_statx(-1,(char *)p_Var24,0,0,(uv_stat_t *)buf);
      if (iVar4 == -0x26) {
        iVar4 = stat64((char *)p_Var24,(stat64 *)local_2038);
LAB_001806f1:
        if (iVar4 == 0) {
          w[-6].loop = (uv_loop_s *)local_2038._0_8_;
          w[-6].wq[0] = (void *)((ulong)local_2020 & 0xffffffff);
          w[-6].wq[1] = local_2028;
          w[-5].work = (_func_void_uv__work_ptr *)((ulong)local_2020 >> 0x20);
          w[-5].done = (_func_void_uv__work_ptr_int *)(ulong)local_2018;
          w[-5].loop = local_2010;
          w[-5].wq[0] = (void *)local_2038._8_8_;
          w[-5].wq[1] = local_2008;
          w[-4].work = (_func_void_uv__work_ptr *)local_2000.__val;
          w[-4].done = (_func_void_uv__work_ptr_int *)CONCAT44(uStack_1ff4,local_1ff8);
          w[-4].wq[1] = local_1ff0;
          w[-3].work = (_func_void_uv__work_ptr *)p_Stack_1fe8;
          w[-3].done = local_1fe0;
          w[-3].loop = puStack_1fd8;
          w[-3].wq[0] = local_1fd0;
          w[-3].wq[1] = local_1fc8;
          w[-2].work = local_1fd0;
          w[-2].done = local_1fc8;
          w[-4].loop = (uv_loop_s *)0x0;
          w[-4].wq[0] = (void *)0x0;
        }
      }
      break;
    case 7:
      p_Var24 = w[-6].done;
      iVar4 = uv__fs_statx(-1,(char *)p_Var24,0,1,(uv_stat_t *)buf);
      if (iVar4 == -0x26) {
        iVar4 = lstat64((char *)p_Var24,(stat64 *)local_2038);
        goto LAB_001806f1;
      }
      break;
    case 8:
      iVar4 = *(int *)w[-2].wq;
      iVar9 = uv__fs_statx(iVar4,"",1,0,(uv_stat_t *)buf);
      if ((iVar9 == -0x26) && (iVar9 = fstat64(iVar4,(stat64 *)local_2038), iVar9 == 0)) {
        w[-6].loop = (uv_loop_s *)local_2038._0_8_;
        w[-6].wq[0] = (void *)((ulong)local_2020 & 0xffffffff);
        w[-6].wq[1] = local_2028;
        w[-5].work = (_func_void_uv__work_ptr *)((ulong)local_2020 >> 0x20);
        w[-5].done = (_func_void_uv__work_ptr_int *)(ulong)local_2018;
        w[-5].loop = local_2010;
        w[-5].wq[0] = (void *)local_2038._8_8_;
        w[-5].wq[1] = local_2008;
        w[-4].work = (_func_void_uv__work_ptr *)local_2000.__val;
        w[-4].done = (_func_void_uv__work_ptr_int *)CONCAT44(uStack_1ff4,local_1ff8);
        w[-4].wq[1] = local_1ff0;
        w[-3].work = (_func_void_uv__work_ptr *)p_Stack_1fe8;
        w[-3].done = local_1fe0;
        w[-3].loop = puStack_1fd8;
        w[-3].wq[0] = local_1fd0;
        w[-3].wq[1] = local_1fc8;
        w[-2].work = local_1fd0;
        w[-2].done = local_1fc8;
        w[-4].loop = (uv_loop_s *)0x0;
        w[-4].wq[0] = (void *)0x0;
      }
      p_Var24 = (_func_void_uv__work_ptr_int *)(long)iVar9;
      goto LAB_0018102a;
    case 9:
      iVar4 = ftruncate64(*(int *)w[-2].wq,(__off64_t)w[-1].done);
      break;
    case 10:
      local_2038._0_8_ = (undefined8)(double)w[-1].wq[0];
      dVar28 = (double)w[-1].wq[0] * 1000000.0;
      uVar19 = (ulong)dVar28;
      local_2038._8_8_ =
           (((long)(dVar28 - 9.223372036854776e+18) & (long)uVar19 >> 0x3f | uVar19) % 1000000) *
           1000;
      local_2028 = (void *)(long)(double)w[-1].wq[1];
      dVar28 = (double)w[-1].wq[1] * 1000000.0;
      uVar19 = (ulong)dVar28;
      local_2020 = (void *)((((long)(dVar28 - 9.223372036854776e+18) & (long)uVar19 >> 0x3f | uVar19
                             ) % 1000000) * 1000);
      iVar4 = utimensat(-100,(char *)w[-6].done,(timespec *)local_2038,0);
      break;
    case 0xb:
      local_2038._0_8_ = (undefined8)(double)w[-1].wq[0];
      dVar28 = (double)w[-1].wq[0] * 1000000.0;
      uVar19 = (ulong)dVar28;
      local_2038._8_8_ =
           (((long)(dVar28 - 9.223372036854776e+18) & (long)uVar19 >> 0x3f | uVar19) % 1000000) *
           1000;
      local_2028 = (void *)(long)(double)w[-1].wq[1];
      dVar28 = (double)w[-1].wq[1] * 1000000.0;
      uVar19 = (ulong)dVar28;
      local_2020 = (void *)((((long)(dVar28 - 9.223372036854776e+18) & (long)uVar19 >> 0x3f | uVar19
                             ) % 1000000) * 1000);
      iVar4 = futimens(*(int *)w[-2].wq,(timespec *)local_2038);
      break;
    case 0xc:
      iVar4 = access((char *)w[-6].done,*(int *)((long)w[-2].wq + 4));
      break;
    case 0xd:
      iVar4 = chmod((char *)w[-6].done,*(__mode_t *)(w[-2].wq + 1));
      break;
    case 0xe:
      iVar4 = fchmod(*(int *)w[-2].wq,*(__mode_t *)(w[-2].wq + 1));
      break;
    case 0xf:
      iVar4 = fsync(*(int *)w[-2].wq);
      break;
    case 0x10:
      iVar4 = fdatasync(*(int *)w[-2].wq);
      break;
    case 0x11:
      iVar4 = unlink((char *)w[-6].done);
      break;
    case 0x12:
      iVar4 = rmdir((char *)w[-6].done);
      break;
    case 0x13:
      iVar4 = mkdir((char *)w[-6].done,*(__mode_t *)(w[-2].wq + 1));
      break;
    case 0x14:
      pcVar18 = mkdtemp((char *)w[-6].done);
      p_Var24 = (_func_void_uv__work_ptr_int *)-(ulong)(pcVar18 == (char *)0x0);
      goto LAB_0018102a;
    case 0x15:
      iVar4 = rename((char *)w[-6].done,(char *)w[-2].loop);
      break;
    case 0x16:
      local_2038._0_8_ = (uv_loop_s *)0x0;
      iVar4 = scandir64((char *)w[-6].done,(dirent64 ***)local_2038,uv__fs_scandir_filter,
                        uv__fs_scandir_sort);
      *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
      if (iVar4 != -1) {
        if (iVar4 == 0) {
          free((void *)local_2038._0_8_);
          local_2038._0_8_ = (uv_loop_s *)0x0;
        }
        w[-6].work = (_func_void_uv__work_ptr *)local_2038._0_8_;
        goto LAB_001806a2;
      }
      p_Var24 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      goto LAB_0018102a;
    case 0x17:
      iVar4 = link((char *)w[-6].done,(char *)w[-2].loop);
      break;
    case 0x18:
      iVar4 = symlink((char *)w[-6].done,(char *)w[-2].loop);
      break;
    case 0x19:
      sVar16 = pathconf((char *)w[-6].done,4);
      sVar27 = 0x100;
      if (sVar16 != 0xffffffffffffffff) {
        sVar27 = sVar16;
      }
      p_Var14 = (_func_void_uv__work_ptr *)uv__malloc(sVar27);
      if (p_Var14 == (_func_void_uv__work_ptr *)0x0) {
        *puVar12 = 0xc;
        goto LAB_00180a3f;
      }
      sVar16 = readlink((char *)w[-6].done,(char *)p_Var14,sVar27);
      if ((sVar16 == 0xffffffffffffffff) ||
         ((p_Var17 = p_Var14, sVar16 == sVar27 &&
          (p_Var17 = (_func_void_uv__work_ptr *)uv__realloc(p_Var14,sVar16 + 1),
          p_Var17 == (_func_void_uv__work_ptr *)0x0)))) {
        uv__free(p_Var14);
        p_Var24 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      }
      else {
        p_Var17[sVar16] = (_func_void_uv__work_ptr)0x0;
        w[-6].work = p_Var17;
        p_Var24 = (_func_void_uv__work_ptr_int *)0x0;
      }
      goto LAB_0018102a;
    case 0x1a:
      iVar4 = chown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
      break;
    case 0x1b:
      iVar4 = fchown(*(int *)w[-2].wq,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
      break;
    case 0x1c:
      p_Var14 = (_func_void_uv__work_ptr *)realpath((char *)w[-6].done,(char *)0x0);
      if (p_Var14 != (_func_void_uv__work_ptr *)0x0) {
LAB_00180049:
        w[-6].work = p_Var14;
        goto LAB_00180945;
      }
      goto LAB_00180a3f;
    case 0x1d:
      uVar8 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-6].done,0,0,(uv_fs_cb)0x0
                        );
      uv_fs_req_cleanup((uv_fs_t *)local_2038);
      if ((int)uVar8 < 0) {
        p_Var24 = (_func_void_uv__work_ptr_int *)(long)(int)uVar8;
      }
      else {
        iVar4 = fstat64(uVar8,&local_21d0);
        __mode = local_21d0.st_mode;
        if (iVar4 == 0) {
          iVar9 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-2].loop,
                             (*(uint *)((long)w[-2].wq + 4) & 1) << 7 | 0x241,local_21d0.st_mode,
                             (uv_fs_cb)0x0);
          uv_fs_req_cleanup((uv_fs_t *)local_2038);
          iVar4 = iVar9;
          if (-1 < iVar9) {
            iVar4 = fstat64(iVar9,&local_2140);
            if (iVar4 == 0) {
              if (((_func_void_uv__work_ptr_int *)
                   CONCAT26(local_21d0.st_dev._6_2_,
                            CONCAT24(local_21d0.st_dev._4_2_,(int)local_21d0.st_dev)) ==
                   (_func_void_uv__work_ptr_int *)local_2140.st_dev) &&
                 (local_21d0.st_ino == local_2140.st_ino)) {
LAB_00181184:
                iVar4 = 0;
              }
              else {
                iVar4 = fchmod(iVar9,__mode);
                if (iVar4 == -1) {
                  if (*puVar12 == 1) {
                    iVar11 = fstatfs64(iVar9,&local_20b0);
                    iVar4 = -1;
                    if ((iVar11 != -1) && (local_20b0.f_type == 0xff534d42)) goto LAB_00181090;
                  }
                  else {
                    iVar4 = -*puVar12;
                  }
                }
                else {
LAB_00181090:
                  if (((ulong)w[-2].wq[0] & 0x600000000) != 0) {
                    iVar4 = 0;
                    iVar11 = ioctl(iVar9,0x40049409,(ulong)uVar8);
                    if (iVar11 == 0) goto LAB_00180f56;
                    if (((ulong)w[-2].wq[0] & 0x400000000) != 0) goto LAB_00180c0a;
                  }
                  if (local_21d0.st_size == 0) goto LAB_00181184;
                  p_Var24 = (_func_void_uv__work_ptr_int *)0x0;
                  sVar27 = local_21d0.st_size;
                  do {
                    local_2038._8_4_ = 6;
                    local_1ff8 = UV_FS_SENDFILE;
                    iVar4 = 0;
                    local_1f28 = (char *)0x0;
                    local_1f10 = (uv_buf_t *)0x0;
                    local_1fd0 = (_func_void_uv__work_ptr *)0x0;
                    local_1fe0 = (_func_void_uv__work_ptr_int *)0x0;
                    puStack_1fd8 = (uv_loop_s *)0x0;
                    local_1ff0 = (uv_loop_t *)0x0;
                    p_Stack_1fe8 = (uv_fs_cb)0x0;
                    local_1f20 = iVar9;
                    local_1f1c = uVar8;
                    local_1f08 = p_Var24;
                    local_1eb8 = sVar27;
                    uv__fs_work(&local_1ee8);
                    p_Var26 = local_1fe0;
                    uv_fs_req_cleanup((uv_fs_t *)local_2038);
                    if ((long)p_Var26 < 0) {
                      iVar4 = (int)p_Var26;
                      break;
                    }
                    p_Var24 = p_Var24 + (long)p_Var26;
                    sVar27 = sVar27 - (long)p_Var26;
                  } while (sVar27 != 0);
                }
              }
            }
            else {
LAB_00180c0a:
              iVar4 = -*puVar12;
            }
          }
        }
        else {
          iVar9 = -1;
          iVar4 = -*puVar12;
        }
LAB_00180f56:
        iVar11 = 0;
        if (iVar4 < 0) {
          iVar11 = iVar4;
        }
        iVar10 = uv__close_nocheckstdio(uVar8);
        if (iVar10 == 0) {
          iVar10 = iVar11;
        }
        if (iVar4 < 0) {
          iVar10 = iVar11;
        }
        if (-1 < iVar9) {
          iVar4 = uv__close_nocheckstdio(iVar9);
          if (iVar4 == 0) {
            iVar4 = iVar10;
          }
          if (iVar10 != 0) {
            iVar4 = iVar10;
          }
          iVar10 = 0;
          if (iVar4 != 0) {
            uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-2].loop,(uv_fs_cb)0x0);
            uv_fs_req_cleanup((uv_fs_t *)local_2038);
            iVar10 = iVar4;
          }
        }
        if (iVar10 == 0) {
          p_Var24 = (_func_void_uv__work_ptr_int *)0x0;
        }
        else {
          *puVar12 = -iVar10;
          p_Var24 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
        }
      }
      goto LAB_0018102a;
    case 0x1e:
      iVar4 = lchown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4))
      ;
      break;
    case 0x1f:
      p_Var14 = (_func_void_uv__work_ptr *)uv__malloc(0x38);
      if (p_Var14 != (_func_void_uv__work_ptr *)0x0) {
        pDVar20 = opendir((char *)w[-6].done);
        *(DIR **)(p_Var14 + 0x30) = pDVar20;
        if (pDVar20 != (DIR *)0x0) {
          w[-6].work = p_Var14;
          goto LAB_00180945;
        }
      }
      uv__free(p_Var14);
      w[-6].work = (_func_void_uv__work_ptr *)0x0;
LAB_00180a3f:
      p_Var24 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      goto LAB_0018102a;
    case 0x20:
      p_Var14 = w[-6].work;
      if (*(long *)(p_Var14 + 8) != 0) {
        uVar19 = 0;
LAB_00180538:
        do {
          *puVar12 = 0;
          dent = readdir64(*(DIR **)(p_Var14 + 0x30));
          uVar8 = (uint)uVar19;
          if (dent == (dirent64 *)0x0) {
            if (*puVar12 != 0) {
LAB_00180ab4:
              if (uVar8 != 0) {
                lVar25 = 0;
                do {
                  uv__free(*(void **)(*(long *)p_Var14 + lVar25));
                  *(undefined8 *)(*(long *)p_Var14 + lVar25) = 0;
                  lVar25 = lVar25 + 0x10;
                } while (uVar19 << 4 != lVar25);
              }
              uVar8 = 0xffffffff;
            }
            break;
          }
          pcVar18 = dent->d_name;
          iVar4 = strcmp(pcVar18,".");
          if ((iVar4 == 0) || (iVar4 = strcmp(pcVar18,".."), iVar4 == 0)) goto LAB_00180582;
          lVar25 = *(long *)p_Var14;
          pcVar18 = uv__strdup(pcVar18);
          *(char **)(lVar25 + uVar19 * 0x10) = pcVar18;
          if (pcVar18 == (char *)0x0) goto LAB_00180ab4;
          uVar7 = uv__fs_get_dirent_type((uv__dirent_t *)dent);
          *(uv_dirent_type_t *)(lVar25 + uVar19 * 0x10 + 8) = uVar7;
          uVar8 = uVar8 + 1;
          uVar19 = (ulong)uVar8;
        } while (uVar19 < *(ulong *)(p_Var14 + 8));
        goto LAB_00180f17;
      }
      uVar8 = 0;
LAB_00180f17:
      p_Var24 = (_func_void_uv__work_ptr_int *)(long)(int)uVar8;
      goto LAB_0018102a;
    case 0x21:
      p_Var14 = w[-6].work;
      pDVar20 = *(DIR **)(p_Var14 + 0x30);
      if (pDVar20 != (DIR *)0x0) {
        closedir(pDVar20);
        *(undefined8 *)(p_Var14 + 0x30) = 0;
      }
      uv__free(w[-6].work);
      w[-6].work = (_func_void_uv__work_ptr *)0x0;
LAB_00180945:
      p_Var24 = (_func_void_uv__work_ptr_int *)0x0;
      goto LAB_0018102a;
    case 0x22:
      iVar4 = statfs64((char *)w[-6].done,(statfs64 *)local_2038);
      p_Var24 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      if (iVar4 == 0) {
        p_Var14 = (_func_void_uv__work_ptr *)uv__malloc(0x58);
        if (p_Var14 != (_func_void_uv__work_ptr *)0x0) {
          *(undefined8 *)p_Var14 = local_2038._0_8_;
          *(undefined8 *)(p_Var14 + 8) = local_2038._8_8_;
          *(void **)(p_Var14 + 0x10) = local_2028;
          *(void **)(p_Var14 + 0x18) = local_2020;
          *(long *)(p_Var14 + 0x20) = CONCAT44(iStack_2014,local_2018);
          *(uv_loop_s **)(p_Var14 + 0x28) = local_2010;
          *(void **)(p_Var14 + 0x30) = local_2008;
          goto LAB_00180049;
        }
        *puVar12 = 0xc;
      }
      goto LAB_0018102a;
    case 0x23:
      p_Var24 = w[-6].done;
      sVar13 = strlen((char *)p_Var24);
      if ((sVar13 < 6) || (iVar4 = strcmp((char *)(p_Var24 + (sVar13 - 6)),"XXXXXX"), iVar4 != 0)) {
        *puVar12 = 0x16;
        iVar4 = -1;
      }
      else {
        uv_once(&uv__fs_mkstemp_once,uv__mkostemp_initonce);
        if (uv__mkostemp != (_func_int_char_ptr_int *)0x0 &&
            (uv__fs_mkstemp_no_cloexec_support & 1) == 0) {
          iVar4 = (*uv__mkostemp)((char *)p_Var24,0x80000);
          if ((-1 < iVar4) || (*puVar12 != 0x16)) goto LAB_001806a2;
          uv__fs_mkstemp_no_cloexec_support = 1;
        }
        if (w[-7].wq[0] != (void *)0x0) {
          uv_rwlock_rdlock(&(w[-7].loop)->cloexec_lock);
        }
        iVar4 = mkstemp64((char *)p_Var24);
        if ((-1 < iVar4) && (iVar9 = uv__cloexec_ioctl(iVar4,1), iVar9 != 0)) {
          iVar9 = uv__close(iVar4);
          iVar4 = -1;
          if (iVar9 != 0) {
switchD_0017ff20_default:
            abort();
          }
        }
        if (w[-7].wq[0] != (void *)0x0) {
          uv_rwlock_rdunlock(&(w[-7].loop)->cloexec_lock);
        }
      }
LAB_001806a2:
      p_Var24 = (_func_void_uv__work_ptr_int *)(long)iVar4;
      goto LAB_0018102a;
    default:
      goto switchD_0017ff20_default;
    }
    p_Var24 = (_func_void_uv__work_ptr_int *)(long)iVar4;
LAB_0018102a:
    p_Var26 = p_Var24;
    if (p_Var24 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) goto LAB_00181229;
  } while ((iVar1 - 4U < 0xfffffffe) && (*puVar12 == 4));
  p_Var26 = (_func_void_uv__work_ptr_int *)-(long)(int)*puVar12;
LAB_00181229:
  w[-7].wq[1] = p_Var26;
  if ((p_Var24 == (_func_void_uv__work_ptr_int *)0x0) && (*(int *)&w[-7].done - 6U < 3)) {
    w[-6].work = (_func_void_uv__work_ptr *)buf;
  }
  return;
LAB_00180582:
  if (*(ulong *)(p_Var14 + 8) <= uVar19) goto LAB_00180f17;
  goto LAB_00180538;
LAB_00180e76:
  lVar25 = lVar25 + sVar15;
  sVar13 = sVar21 - lVar25;
  if (sVar13 == 0 || (long)sVar21 < lVar25) goto LAB_00180e8d;
  goto LAB_00180dee;
}

Assistant:

static void uv__fs_work(struct uv__work* w) {
  int retry_on_eintr;
  uv_fs_t* req;
  ssize_t r;

  req = container_of(w, uv_fs_t, work_req);
  retry_on_eintr = !(req->fs_type == UV_FS_CLOSE ||
                     req->fs_type == UV_FS_READ);

  do {
    errno = 0;

#define X(type, action)                                                       \
  case UV_FS_ ## type:                                                        \
    r = action;                                                               \
    break;

    switch (req->fs_type) {
    X(ACCESS, access(req->path, req->flags));
    X(CHMOD, chmod(req->path, req->mode));
    X(CHOWN, chown(req->path, req->uid, req->gid));
    X(CLOSE, uv__fs_close(req->file));
    X(COPYFILE, uv__fs_copyfile(req));
    X(FCHMOD, fchmod(req->file, req->mode));
    X(FCHOWN, fchown(req->file, req->uid, req->gid));
    X(LCHOWN, lchown(req->path, req->uid, req->gid));
    X(FDATASYNC, uv__fs_fdatasync(req));
    X(FSTAT, uv__fs_fstat(req->file, &req->statbuf));
    X(FSYNC, uv__fs_fsync(req));
    X(FTRUNCATE, ftruncate(req->file, req->off));
    X(FUTIME, uv__fs_futime(req));
    X(LSTAT, uv__fs_lstat(req->path, &req->statbuf));
    X(LINK, link(req->path, req->new_path));
    X(MKDIR, mkdir(req->path, req->mode));
    X(MKDTEMP, uv__fs_mkdtemp(req));
    X(MKSTEMP, uv__fs_mkstemp(req));
    X(OPEN, uv__fs_open(req));
    X(READ, uv__fs_read(req));
    X(SCANDIR, uv__fs_scandir(req));
    X(OPENDIR, uv__fs_opendir(req));
    X(READDIR, uv__fs_readdir(req));
    X(CLOSEDIR, uv__fs_closedir(req));
    X(READLINK, uv__fs_readlink(req));
    X(REALPATH, uv__fs_realpath(req));
    X(RENAME, rename(req->path, req->new_path));
    X(RMDIR, rmdir(req->path));
    X(SENDFILE, uv__fs_sendfile(req));
    X(STAT, uv__fs_stat(req->path, &req->statbuf));
    X(STATFS, uv__fs_statfs(req));
    X(SYMLINK, symlink(req->path, req->new_path));
    X(UNLINK, unlink(req->path));
    X(UTIME, uv__fs_utime(req));
    X(WRITE, uv__fs_write_all(req));
    default: abort();
    }
#undef X
  } while (r == -1 && errno == EINTR && retry_on_eintr);

  if (r == -1)
    req->result = UV__ERR(errno);
  else
    req->result = r;

  if (r == 0 && (req->fs_type == UV_FS_STAT ||
                 req->fs_type == UV_FS_FSTAT ||
                 req->fs_type == UV_FS_LSTAT)) {
    req->ptr = &req->statbuf;
  }
}